

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_visitor.hpp
# Opt level: O0

bool __thiscall
jsoncons::basic_json_visitor<wchar_t>::visit_half
          (basic_json_visitor<wchar_t> *this,uint16_t value,semantic_tag tag,ser_context *context,
          error_code *ec)

{
  undefined8 in_RCX;
  undefined1 in_DL;
  long *in_RDI;
  undefined8 in_R8;
  uint16_t unaff_retaddr;
  
  binary::decode_half(unaff_retaddr);
  (**(code **)(*in_RDI + 0x90))(in_RDI,in_DL,in_RCX,in_R8);
  return true;
}

Assistant:

virtual JSONCONS_VISITOR_RETURN_TYPE visit_half(uint16_t value, 
            semantic_tag tag,
            const ser_context& context,
            std::error_code& ec)
        {
            visit_double(binary::decode_half(value),
                tag,
                context,
                ec);
            JSONCONS_VISITOR_RETURN;
        }